

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::~ConcurrentQueue(ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
                   *this)

{
  bool *pbVar1;
  ProducerBase *pPVar2;
  ImplicitProducerHash *pIVar3;
  Block *p;
  __pointer_type pBVar4;
  atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
  *in_RDI;
  __pointer_type next_1;
  Block *block;
  size_t i;
  ImplicitProducerHash *prev;
  __pointer_type hash;
  ProducerBase *next;
  __pointer_type ptr;
  size_t in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  Block *local_38;
  size_t local_30;
  __pointer_type local_20;
  ProducerBase *local_10;
  
  local_10 = std::
             atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
             ::load((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase_*>
                     *)in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  while (local_10 != (ProducerBase *)0x0) {
    pPVar2 = ProducerBase::next_prod(local_10);
    if ((local_10->super_ConcurrentQueueProducerTypelessBase).token != (ProducerToken *)0x0) {
      ((local_10->super_ConcurrentQueueProducerTypelessBase).token)->producer =
           (ConcurrentQueueProducerTypelessBase *)0x0;
    }
    ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
    ::
    destroy<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ProducerBase>
              ((ProducerBase *)0x349f2c);
    local_10 = pPVar2;
  }
  pIVar3 = std::
           atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
           ::load((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                   *)in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  while (local_20 = pIVar3, local_20 != (__pointer_type)0x0) {
    pIVar3 = local_20->prev;
    if (pIVar3 != (ImplicitProducerHash *)0x0) {
      for (local_30 = 0; local_30 != local_20->capacity; local_30 = local_30 + 1) {
      }
      ConcurrentQueueDefaultTraits::free(local_20);
    }
  }
  p = FreeList<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
      ::head_unsafe((FreeList<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
                     *)0x349fb9);
  local_38 = p;
  while (local_38 != (Block *)0x0) {
    pBVar4 = std::
             atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block_*>
             ::load(in_RDI,(memory_order)((ulong)p >> 0x20));
    pbVar1 = &local_38->dynamicallyAllocated;
    local_38 = pBVar4;
    if ((*pbVar1 & 1U) != 0) {
      ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
      ::
      destroy<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
                ((Block *)0x34a002);
    }
  }
  ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
  ::
  destroy_array<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::Block>
            (p,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

~ConcurrentQueue() {
    // Destroy producers
    auto ptr = producerListTail.load(std::memory_order_relaxed);
    while (ptr != nullptr) {
      auto next = ptr->next_prod();
      if (ptr->token != nullptr) {
        ptr->token->producer = nullptr;
      }
      destroy(ptr);
      ptr = next;
    }

    // Destroy implicit producer hash tables
    MOODYCAMEL_CONSTEXPR_IF(INITIAL_IMPLICIT_PRODUCER_HASH_SIZE != 0) {
      auto hash = implicitProducerHash.load(std::memory_order_relaxed);
      while (hash != nullptr) {
        auto prev = hash->prev;
        if (prev != nullptr) {  // The last hash is part of this object and was
                                // not allocated dynamically
          for (size_t i = 0; i != hash->capacity; ++i) {
            hash->entries[i].~ImplicitProducerKVP();
          }
          hash->~ImplicitProducerHash();
          (Traits::free)(hash);
        }
        hash = prev;
      }
    }

    // Destroy global free list
    auto block = freeList.head_unsafe();
    while (block != nullptr) {
      auto next = block->freeListNext.load(std::memory_order_relaxed);
      if (block->dynamicallyAllocated) {
        destroy(block);
      }
      block = next;
    }

    // Destroy initial free list
    destroy_array(initialBlockPool, initialBlockPoolSize);
  }